

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void trie_insert(trie_node *root,trie_node *new,uint lvl)

{
  long lVar1;
  _Bool _Var2;
  long in_FS_OFFSET;
  uint lvl_local;
  trie_node *new_local;
  trie_node *root_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (new->len < root->len) {
    swap_nodes(root,new);
  }
  _Var2 = is_left_child(&new->prefix,lvl);
  if (_Var2) {
    if (root->lchild == (trie_node *)0x0) {
      add_child_node(root,new,LEFT);
    }
    else {
      trie_insert(root->lchild,new,lvl + 1);
    }
  }
  else if (root->rchild == (trie_node *)0x0) {
    add_child_node(root,new,RIGHT);
  }
  else {
    trie_insert(root->rchild,new,lvl + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void trie_insert(struct trie_node *root, struct trie_node *new, const unsigned int lvl)
{
	if (new->len < root->len)
		swap_nodes(root, new);

	if (is_left_child(&new->prefix, lvl)) {
		if (!root->lchild)
			return add_child_node(root, new, LEFT);

		return trie_insert(root->lchild, new, lvl + 1);
	}

	if (!root->rchild)
		return add_child_node(root, new, RIGHT);

	trie_insert(root->rchild, new, lvl + 1);
}